

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-client.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ssize_t sVar6;
  size_t size;
  ulong uVar7;
  char *pcVar8;
  undefined1 uVar9;
  int sock;
  addrinfo *ai;
  sockaddr_in addr;
  termios tios;
  char buffer [512];
  int local_2d4;
  addrinfo *local_2d0;
  pollfd local_2c8;
  undefined8 uStack_2c0;
  sockaddr local_2b8;
  addrinfo local_2a8;
  termios local_278;
  char local_238 [520];
  
  if (argc < 2) {
    main_cold_6();
  }
  else {
    if (argc == 2) {
      pcVar5 = "23";
    }
    else {
      pcVar5 = argv[2];
    }
    pcVar8 = argv[1];
    local_2a8.ai_flags = 0;
    local_2a8.ai_family = 0;
    local_2a8.ai_canonname = (char *)0x0;
    local_2a8.ai_next = (addrinfo *)0x0;
    local_2a8.ai_addrlen = 0;
    local_2a8._20_4_ = 0;
    local_2a8.ai_addr = (sockaddr *)0x0;
    local_2a8.ai_socktype = 1;
    local_2a8.ai_protocol = 0;
    iVar2 = getaddrinfo(pcVar8,pcVar5,&local_2a8,&local_2d0);
    __stream = _stderr;
    if (iVar2 == 0) {
      iVar2 = socket(2,1,0);
      local_2d4 = iVar2;
      if (iVar2 == -1) {
        main_cold_5();
        return 1;
      }
      local_2b8.sa_data[6] = '\0';
      local_2b8.sa_data[7] = '\0';
      local_2b8.sa_data[8] = '\0';
      local_2b8.sa_data[9] = '\0';
      local_2b8.sa_data[10] = '\0';
      local_2b8.sa_data[0xb] = '\0';
      local_2b8.sa_data[0xc] = '\0';
      local_2b8.sa_data[0xd] = '\0';
      local_2b8.sa_family = 2;
      local_2b8.sa_data[0] = '\0';
      local_2b8.sa_data[1] = '\0';
      local_2b8.sa_data[2] = '\0';
      local_2b8.sa_data[3] = '\0';
      local_2b8.sa_data[4] = '\0';
      local_2b8.sa_data[5] = '\0';
      iVar3 = bind(iVar2,&local_2b8,0x10);
      if (iVar3 == -1) {
        main_cold_4();
      }
      else {
        iVar2 = connect(iVar2,local_2d0->ai_addr,local_2d0->ai_addrlen);
        if (iVar2 != -1) {
          freeaddrinfo(local_2d0);
          tcgetattr(1,(termios *)&orig_tios);
          atexit(_cleanup);
          local_278.c_iflag = orig_tios.c_iflag;
          local_278.c_oflag = orig_tios.c_oflag;
          local_278.c_cflag = orig_tios.c_cflag;
          local_278.c_lflag = orig_tios.c_lflag;
          local_278.c_line = orig_tios.c_line;
          local_278.c_cc[0] = orig_tios.c_cc[0];
          local_278.c_cc[1] = orig_tios.c_cc[1];
          local_278.c_cc[2] = orig_tios.c_cc[2];
          local_278.c_cc[3] = orig_tios.c_cc[3];
          local_278.c_cc[4] = orig_tios.c_cc[4];
          local_278.c_cc[5] = orig_tios.c_cc[5];
          local_278.c_cc[6] = orig_tios.c_cc[6];
          local_278.c_cc[7] = orig_tios.c_cc[7];
          local_278.c_cc[8] = orig_tios.c_cc[8];
          local_278.c_cc[9] = orig_tios.c_cc[9];
          local_278.c_cc[10] = orig_tios.c_cc[10];
          local_278.c_cc[0xb] = orig_tios.c_cc[0xb];
          local_278.c_cc[0xc] = orig_tios.c_cc[0xc];
          local_278.c_cc[0xd] = orig_tios.c_cc[0xd];
          local_278.c_cc[0xe] = orig_tios.c_cc[0xe];
          local_278.c_cc[0xf] = orig_tios.c_cc[0xf];
          local_278.c_cc[0x10] = orig_tios.c_cc[0x10];
          local_278.c_cc[0x11] = orig_tios.c_cc[0x11];
          local_278.c_cc[0x12] = orig_tios.c_cc[0x12];
          local_278.c_cc[0x13] = orig_tios.c_cc[0x13];
          local_278.c_cc[0x14] = orig_tios.c_cc[0x14];
          local_278.c_cc[0x15] = orig_tios.c_cc[0x15];
          local_278.c_cc[0x16] = orig_tios.c_cc[0x16];
          local_278.c_cc[0x17] = orig_tios.c_cc[0x17];
          local_278.c_cc[0x18] = orig_tios.c_cc[0x18];
          local_278.c_cc[0x19] = orig_tios.c_cc[0x19];
          local_278.c_cc[0x1a] = orig_tios.c_cc[0x1a];
          local_278.c_cc[0x1b] = orig_tios.c_cc[0x1b];
          local_278.c_cc[0x1c] = orig_tios.c_cc[0x1c];
          local_278.c_cc[0x1d] = orig_tios.c_cc[0x1d];
          local_278.c_cc[0x1e] = orig_tios.c_cc[0x1e];
          local_278.c_cc[0x1f] = orig_tios.c_cc[0x1f];
          local_278._49_3_ = orig_tios._49_3_;
          local_278.c_ispeed = orig_tios.c_ispeed;
          local_278.c_ospeed = orig_tios.c_ospeed;
          cfmakeraw((termios *)&local_278);
          tcsetattr(1,1,(termios *)&local_278);
          do_echo = '\x01';
          telnet = telnet_init(telopts,_event_handler,'\0',&local_2d4);
          local_2c8.fd = 0;
          local_2c8.events = 1;
          local_2c8.revents = 0;
          uStack_2c0 = (ulong)CONCAT24(1,local_2d4);
          iVar2 = poll(&local_2c8,2,-1);
          if (iVar2 != -1) {
            do {
              if (((ulong)local_2c8 & 0x19000000000000) != 0) {
                sVar6 = read(0,local_238,0x200);
                uVar4 = (uint)sVar6;
                uVar9 = uVar4 == 0;
                if (0 < (int)uVar4) {
                  uVar7 = (ulong)(uVar4 & 0x7fffffff);
                  pcVar5 = local_238;
                  do {
                    cVar1 = *pcVar5;
                    if ((cVar1 == '\r') || (cVar1 == '\n')) {
                      if (do_echo == '\x01') {
                        puts("\r");
                      }
                      size = 2;
                      pcVar8 = (char *)&_input_crlf;
                    }
                    else {
                      if (do_echo == '\x01') {
                        putchar((int)cVar1);
                      }
                      size = 1;
                      pcVar8 = pcVar5;
                    }
                    telnet_send(telnet,pcVar8,size);
                    pcVar5 = pcVar5 + 1;
                    uVar7 = uVar7 - 1;
                  } while (uVar7 != 0);
                  fflush(_stdout);
                  goto LAB_00101739;
                }
                if (!(bool)uVar9) {
                  main_cold_1();
LAB_00101792:
                  if (!(bool)uVar9) {
                    main_cold_2();
                    iVar2 = tcsetattr(1,1,(termios *)&orig_tios);
                    return iVar2;
                  }
                }
                break;
              }
LAB_00101739:
              if ((uStack_2c0 & 0x19000000000000) != 0) {
                sVar6 = recv(local_2d4,local_238,0x200,0);
                uVar4 = (uint)sVar6;
                uVar9 = uVar4 == 0;
                if ((int)uVar4 < 1) goto LAB_00101792;
                telnet_recv(telnet,local_238,(ulong)(uVar4 & 0x7fffffff));
              }
              iVar2 = poll(&local_2c8,2,-1);
            } while (iVar2 != -1);
          }
          telnet_free(telnet);
          close(local_2d4);
          return 0;
        }
        main_cold_3();
      }
    }
    else {
      pcVar5 = gai_strerror(iVar2);
      fprintf(__stream,"getaddrinfo() failed for %s: %s\n",pcVar8,pcVar5);
    }
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	int rs;
	int sock;
	struct sockaddr_in addr;
	struct pollfd pfd[2];
	struct addrinfo *ai;
	struct addrinfo hints;
	struct termios tios;
	const char *servname;
	const char *hostname;

	/* check usage */
	if (argc < 2) {
		fprintf(stderr, "Usage:\n ./telnet-client <host> [port]\n");
		return 1;
	}

	/* process arguments */
	servname = (argc < 3) ? "23" : argv[2];
	hostname = argv[1];

	/* look up server host */
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	if ((rs = getaddrinfo(hostname, servname, &hints, &ai)) != 0) {
		fprintf(stderr, "getaddrinfo() failed for %s: %s\n", hostname,
				gai_strerror(rs));
		return 1;
	}
	
	/* create server socket */
	if ((sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
		fprintf(stderr, "socket() failed: %s\n", strerror(errno));
		return 1;
	}

	/* bind server socket */
	memset(&addr, 0, sizeof(addr));
	addr.sin_family = AF_INET;
	if (bind(sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
		fprintf(stderr, "bind() failed: %s\n", strerror(errno));
		close(sock);
		return 1;
	}

	/* connect */
	if (connect(sock, ai->ai_addr, ai->ai_addrlen) == -1) {
		fprintf(stderr, "connect() failed: %s\n", strerror(errno));
		close(sock);
		return 1;
	}

	/* free address lookup info */
	freeaddrinfo(ai);

	/* get current terminal settings, set raw mode, make sure we
	 * register atexit handler to restore terminal settings
	 */
	tcgetattr(STDOUT_FILENO, &orig_tios);
	atexit(_cleanup);
	tios = orig_tios;
	cfmakeraw(&tios);
	tcsetattr(STDOUT_FILENO, TCSADRAIN, &tios);

	/* set input echoing on by default */
	do_echo = 1;

	/* initialize telnet box */
	telnet = telnet_init(telopts, _event_handler, 0, &sock);

	/* initialize poll descriptors */
	memset(pfd, 0, sizeof(pfd));
	pfd[0].fd = STDIN_FILENO;
	pfd[0].events = POLLIN;
	pfd[1].fd = sock;
	pfd[1].events = POLLIN;

	/* loop while both connections are open */
	while (poll(pfd, 2, -1) != -1) {
		/* read from stdin */
		if (pfd[0].revents & (POLLIN | POLLERR | POLLHUP)) {
			if ((rs = read(STDIN_FILENO, buffer, sizeof(buffer))) > 0) {
				_input(buffer, rs);
			} else if (rs == 0) {
				break;
			} else {
				fprintf(stderr, "recv(server) failed: %s\n",
						strerror(errno));
				exit(1);
			}
		}

		/* read from client */
		if (pfd[1].revents & (POLLIN | POLLERR | POLLHUP)) {
			if ((rs = recv(sock, buffer, sizeof(buffer), 0)) > 0) {
				telnet_recv(telnet, buffer, rs);
			} else if (rs == 0) {
				break;
			} else {
				fprintf(stderr, "recv(client) failed: %s\n",
						strerror(errno));
				exit(1);
			}
		}
	}

	/* clean up */
	telnet_free(telnet);
	close(sock);

	return 0;
}